

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_context__try_get_device_name_by_id__enum_callback
                    (ma_context *pContext,ma_device_type deviceType,ma_device_info *pDeviceInfo,
                    void *pUserData)

{
  ma_bool32 mVar1;
  
  if (pUserData != (void *)0x0) {
    if (*pUserData == deviceType) {
      mVar1 = (*pContext->onDeviceIDEqual)
                        (pContext,*(ma_device_id **)((long)pUserData + 8),&pDeviceInfo->id);
      if (mVar1 != 0) {
        ma_strncpy_s(*(char **)((long)pUserData + 0x10),*(size_t *)((long)pUserData + 0x18),
                     pDeviceInfo->name,0xffffffffffffffff);
        *(undefined4 *)((long)pUserData + 0x20) = 1;
      }
    }
    return (ma_bool32)(*(int *)((long)pUserData + 0x20) == 0);
  }
  __assert_fail("pData != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x2409,
                "ma_bool32 ma_context__try_get_device_name_by_id__enum_callback(ma_context *, ma_device_type, const ma_device_info *, void *)"
               );
}

Assistant:

static ma_bool32 ma_context__try_get_device_name_by_id__enum_callback(ma_context* pContext, ma_device_type deviceType, const ma_device_info* pDeviceInfo, void* pUserData)
{
    ma_context__try_get_device_name_by_id__enum_callback_data* pData = (ma_context__try_get_device_name_by_id__enum_callback_data*)pUserData;
    MA_ASSERT(pData != NULL);

    if (pData->deviceType == deviceType) {
        if (pContext->onDeviceIDEqual(pContext, pData->pDeviceID, &pDeviceInfo->id)) {
            ma_strncpy_s(pData->pName, pData->nameBufferSize, pDeviceInfo->name, (size_t)-1);
            pData->foundDevice = MA_TRUE;
        }
    }

    return !pData->foundDevice;
}